

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void * rw::mustrealloc_h(void *p,size_t sz,uint32 hint)

{
  void *pvVar1;
  size_t sVar2;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  size_t sVar3;
  
  sVar3 = sz;
  pvVar1 = (void *)(*DAT_00149dd8)(p,sz,CONCAT44(in_register_00000014,hint));
  if (sz == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  mustrealloc_h();
  sVar2 = strlen((char *)p);
  allocLocation = extraout_RDX;
  pvVar1 = (void *)(*Engine::memfuncs)(sVar2 + 1,sVar3 & 0xffffffff);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memcpy(pvVar1,p,sVar2 + 1);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *mustrealloc_h(void *p, size_t sz, uint32 hint)
{
	void *ret;
	ret = Engine::memfuncs.rwrealloc(p, sz, hint);
	if(ret || sz == 0)
		return ret;
	fprintf(stderr, "Error: out of memory\n");
	exit(1);
	return nil;
}